

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
libcellml::Units::addUnit(Units *this,StandardUnit standardUnit,double exponent,string *id)

{
  mapped_type *reference;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *id_local;
  double exponent_local;
  Units *pUStack_10;
  StandardUnit standardUnit_local;
  Units *this_local;
  
  local_28 = id;
  id_local = (string *)exponent;
  exponent_local._4_4_ = standardUnit;
  pUStack_10 = this;
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,(key_type *)((long)&exponent_local + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"0",&local_49);
  addUnit(this,reference,&local_48,(double)id_local,1.0,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void Units::addUnit(StandardUnit standardUnit, double exponent, const std::string &id)
{
    addUnit(standardUnitToString.at(standardUnit), "0", exponent, 1.0, id);
}